

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O1

void __thiscall mocker::Annotator::~Annotator(Annotator *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  
  (this->super_Visitor).super_VisitorBase<false,_true>._vptr_VisitorBase =
       (_func_int **)&PTR_operator___001f3888;
  p_Var1 = (this->builtinNull).
           super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->builtinString).
           super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->builtinBool).
           super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->builtinInt).
           super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->retType).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  puVar2 = (this->scopeResiding).ids.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->scopeResiding).ids.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
    return;
  }
  return;
}

Assistant:

Annotator(ScopeID scopeResiding, SemanticContext &ctx,
            std::unordered_map<ast::NodeID, PosPair> &pos, bool inLoop,
            bool inFunc, std::shared_ptr<ast::Type> retType)
      : scopeResiding(std::move(scopeResiding)), ctx(ctx), pos(pos),
        inLoop(inLoop), inFunc(inFunc), retType(std::move(retType)) {
    builtinBool = mk_ast::tyBool();
    builtinInt = mk_ast::tyInt();
    builtinNull = mk_ast::tyNull();
    builtinString = mk_ast::tyString();
  }